

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O1

boolean mhurtle_step(void *arg,int x,int y)

{
  boolean bVar1;
  boolean bVar2;
  
  bVar2 = '\0';
  bVar1 = goodpos(level,x,y,(monst *)arg,0);
  if (bVar1 != '\0') {
    bVar1 = m_in_out_region((monst *)arg,(xchar)x,(xchar)y);
    if (bVar1 == '\0') {
      bVar2 = '\0';
    }
    else {
      remove_monster(level,(int)*(char *)((long)arg + 0x4f),(int)*(char *)((long)arg + 0x50));
      newsym((int)*(char *)((long)arg + 0x4f),(int)*(char *)((long)arg + 0x50));
      place_monster((monst *)arg,x,y);
      newsym((int)*(char *)((long)arg + 0x4f),(int)*(char *)((long)arg + 0x50));
      set_apparxy(level,(monst *)arg);
      mintrap((monst *)arg);
      bVar2 = '\x01';
    }
  }
  return bVar2;
}

Assistant:

static boolean mhurtle_step(void *arg, int x, int y)
{
	struct monst *mon = (struct monst *)arg;

	/* TODO: Treat walls, doors, iron bars, pools, lava, etc. specially
	 * rather than just stopping before.
	 */
	if (goodpos(level, x, y, mon, 0) && m_in_out_region(mon, x, y)) {
	    remove_monster(level, mon->mx, mon->my);
	    newsym(mon->mx, mon->my);
	    place_monster(mon, x, y);
	    newsym(mon->mx, mon->my);
	    set_apparxy(level, mon);
	    mintrap(mon);
	    return TRUE;
	}
	return FALSE;
}